

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O1

void KeccakP1600_DisplayRoundConstants(FILE *f)

{
  ulong uVar1;
  tKeccakLane *ptVar2;
  ulong uVar3;
  
  ptVar2 = KeccakRoundConstants;
  uVar3 = 0;
  do {
    fprintf((FILE *)f,"RC[%02i][0][0] = ",uVar3 & 0xffffffff);
    uVar1 = *ptVar2;
    fprintf((FILE *)f,"%08X",uVar1 >> 0x20);
    fprintf((FILE *)f,"%08X",uVar1 & 0xffffffff);
    fputc(10,(FILE *)f);
    uVar3 = uVar3 + 1;
    ptVar2 = ptVar2 + 1;
  } while (uVar3 != 0x18);
  fputc(10,(FILE *)f);
  return;
}

Assistant:

void KeccakP1600_DisplayRoundConstants(FILE *f)
{
    unsigned int i;

    for(i=0; i<maxNrRounds; i++) {
        fprintf(f, "RC[%02i][0][0] = ", i);
        fprintf(f, "%08X", (unsigned int)(KeccakRoundConstants[i] >> 32));
        fprintf(f, "%08X", (unsigned int)(KeccakRoundConstants[i] & 0xFFFFFFFFULL));
        fprintf(f, "\n");
    }
    fprintf(f, "\n");
}